

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O2

void embree::instanceIntersectFuncN(RTCIntersectFunctionNArguments *args)

{
  undefined4 uVar1;
  LazyGeometry *instance;
  RTCRayHitN *pRVar2;
  RTCIntersectArguments iargs;
  
  if (*args->valid != 0) {
    instance = (LazyGeometry *)args->geometryUserPtr;
    pRVar2 = args->rayhit;
    if (instance->state != LAZY_VALID) {
      lazyCreate(instance);
    }
    uVar1 = *(undefined4 *)(pRVar2 + 0x48);
    *(undefined4 *)(pRVar2 + 0x48) = 0xffffffff;
    rtcIntersect1(instance->object,pRVar2);
    if (*(int *)(pRVar2 + 0x48) == -1) {
      *(undefined4 *)(pRVar2 + 0x48) = uVar1;
    }
    else {
      *(int *)(pRVar2 + 0x4c) = instance->userID;
    }
  }
  return;
}

Assistant:

void instanceIntersectFuncN(const RTCIntersectFunctionNArguments* args)
{
  const int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  RTCRayQueryContext* context = args->context;
  RTCRayHitN* rays = (RTCRayHitN*)args->rayhit;
  assert(args->N == 1);
  LazyGeometry* instance = (LazyGeometry*)ptr;

  if (!valid[0])
    return;
  
  Ray *ray = (Ray *)rays;
  
  /* create the object if it is not yet created */
  if (instance->state != LAZY_VALID)
    lazyCreate(instance);
  
  /* trace ray inside object */
  const unsigned int geomID = ray->geomID;
  ray->geomID = RTC_INVALID_GEOMETRY_ID;
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.context = context;
  rtcIntersect1(instance->object,RTCRayHit_(*ray),&iargs);
  if (ray->geomID == RTC_INVALID_GEOMETRY_ID) ray->geomID = geomID;
  else ray->instID[0] = instance->userID;
}